

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdCreateSighash(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                    int hash_type,char *pubkey,char *redeem_script,int64_t value_satoshi,
                    int sighash_type,bool sighash_anyone_can_pay,char **sighash)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  AddressType AVar4;
  char *pcVar5;
  CfdException *pCVar6;
  string *psVar7;
  WitnessVersion version;
  allocator local_257;
  allocator local_256;
  bool is_bitcoin;
  uint32_t local_254;
  Script local_250;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_218;
  void *local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  OutPoint local_198;
  SigHashType sighashtype;
  ByteData sighash_bytes;
  Amount value;
  TransactionContext tx;
  SigHashType local_60;
  SigHashType local_54;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_254 = vout;
  local_200 = handle;
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5277c7;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x922;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2d32d1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_250);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5277c7;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x928;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2d32d1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"txid is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. txid is null or empty.",(allocator *)&local_250);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sighash == (char **)0x0) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5277c7;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x92e;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2d32d1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"sighash is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. sighash is null.",(allocator *)&local_250);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar4 = cfd::capi::ConvertHashToAddressType(hash_type);
  version = kVersionNone;
  switch(AVar4) {
  case kP2shAddress:
    bVar2 = 1;
    break;
  case kP2pkhAddress:
    bVar2 = 0;
    break;
  case kP2wshAddress:
  case kP2shP2wshAddress:
    bVar1 = 1;
    goto LAB_003b6bab;
  case kP2wpkhAddress:
  case kP2shP2wpkhAddress:
    bVar1 = 0;
LAB_003b6bab:
    bVar2 = 0;
    version = kVersion0;
    goto LAB_003b6bb8;
  default:
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5277c7;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x94b;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2d32d1;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"hashtype is illegal.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. hashtype is illegal.",(allocator *)&local_250);
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = 0;
LAB_003b6bb8:
  is_bitcoin = false;
  cfd::capi::ConvertNetType(net_type,&is_bitcoin);
  cfd::core::Amount::Amount(&value,value_satoshi);
  cfd::core::ByteData::ByteData(&sighash_bytes);
  cfd::core::SigHashType::Create(&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  if ((bool)(bVar2 | bVar1)) {
    bVar3 = cfd::capi::IsEmptyString(redeem_script);
    if (bVar3) {
      tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)0x5277c7;
      tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x95a;
      tx.super_Transaction.vin_.
      super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2d32d1;
      cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"redeem script is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&tx,"Failed to parameter. redeem script is null or empty.",
                 (allocator *)&local_250);
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (is_bitcoin != true) {
      std::__cxx11::string::string((string *)&local_250,tx_hex_string,(allocator *)&local_198);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string((string *)&local_1d8,txid,&local_256);
      cfd::core::Txid::Txid((Txid *)&local_1b8,&local_1d8);
      cfd::core::OutPoint::OutPoint(&local_198,(Txid *)&local_1b8,local_254);
      std::__cxx11::string::string((string *)&local_1f8,redeem_script,&local_257);
      cfd::core::Script::Script(&local_250,&local_1f8);
      cfd::core::SigHashType::SigHashType(&local_48,&sighashtype);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                ((ByteData *)&local_218,(ConfidentialTransactionContext *)&tx,&local_198,&local_250,
                 &local_48,&value,version);
      cfd::core::ByteData::operator=(&sighash_bytes,(ByteData *)&local_218);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_218);
      cfd::core::Script::~Script(&local_250);
      std::__cxx11::string::~string((string *)&local_1f8);
      cfd::core::Txid::~Txid(&local_198.txid_);
      cfd::core::Txid::~Txid((Txid *)&local_1b8);
      psVar7 = &local_1d8;
LAB_003b713a:
      std::__cxx11::string::~string((string *)psVar7);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx);
      goto LAB_003b714c;
    }
    std::__cxx11::string::string((string *)&local_250,tx_hex_string,(allocator *)&local_198);
    cfd::TransactionContext::TransactionContext(&tx,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string((string *)&local_1d8,txid,&local_256);
    cfd::core::Txid::Txid((Txid *)&local_1b8,&local_1d8);
    cfd::core::OutPoint::OutPoint(&local_198,(Txid *)&local_1b8,local_254);
    std::__cxx11::string::string((string *)&local_1f8,redeem_script,&local_257);
    cfd::core::Script::Script(&local_250,&local_1f8);
    cfd::core::SigHashType::SigHashType(&local_3c,&sighashtype);
    cfd::TransactionContext::CreateSignatureHash
              ((ByteData *)&local_218,&tx,&local_198,&local_250,&local_3c,&value,version);
    cfd::core::ByteData::operator=(&sighash_bytes,(ByteData *)&local_218);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_218);
    cfd::core::Script::~Script(&local_250);
    std::__cxx11::string::~string((string *)&local_1f8);
    cfd::core::Txid::~Txid(&local_198.txid_);
    cfd::core::Txid::~Txid((Txid *)&local_1b8);
    psVar7 = &local_1d8;
  }
  else {
    bVar3 = cfd::capi::IsEmptyString(pubkey);
    if (bVar3) {
      tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)0x5277c7;
      tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x971;
      tx.super_Transaction.vin_.
      super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_2d32d1;
      cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"pubkey is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&tx,"Failed to parameter. pubkey is null or empty.",
                 (allocator *)&local_250);
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (is_bitcoin != true) {
      std::__cxx11::string::string((string *)&local_250,tx_hex_string,(allocator *)&local_198);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string((string *)&local_1b8,txid,&local_256);
      cfd::core::Txid::Txid(&local_198.txid_,&local_1b8);
      cfd::core::OutPoint::OutPoint((OutPoint *)&local_250,&local_198.txid_,local_254);
      std::__cxx11::string::string((string *)&local_1d8,pubkey,&local_257);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_218,&local_1d8);
      cfd::core::SigHashType::SigHashType(&local_60,&sighashtype);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                ((ByteData *)&local_1f8,(ConfidentialTransactionContext *)&tx,(OutPoint *)&local_250
                 ,(Pubkey *)&local_218,&local_60,&value,version);
      cfd::core::ByteData::operator=(&sighash_bytes,(ByteData *)&local_1f8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_218);
      std::__cxx11::string::~string((string *)&local_1d8);
      cfd::core::Txid::~Txid((Txid *)&local_250);
      cfd::core::Txid::~Txid(&local_198.txid_);
      psVar7 = &local_1b8;
      goto LAB_003b713a;
    }
    std::__cxx11::string::string((string *)&local_250,tx_hex_string,(allocator *)&local_198);
    cfd::TransactionContext::TransactionContext(&tx,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string((string *)&local_1b8,txid,&local_256);
    cfd::core::Txid::Txid(&local_198.txid_,&local_1b8);
    cfd::core::OutPoint::OutPoint((OutPoint *)&local_250,&local_198.txid_,local_254);
    std::__cxx11::string::string((string *)&local_1d8,pubkey,&local_257);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_218,&local_1d8);
    cfd::core::SigHashType::SigHashType(&local_54,&sighashtype);
    cfd::TransactionContext::CreateSignatureHash
              ((ByteData *)&local_1f8,&tx,(OutPoint *)&local_250,(Pubkey *)&local_218,&local_54,
               &value,version);
    cfd::core::ByteData::operator=(&sighash_bytes,(ByteData *)&local_1f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_218);
    std::__cxx11::string::~string((string *)&local_1d8);
    cfd::core::Txid::~Txid((Txid *)&local_250);
    cfd::core::Txid::~Txid(&local_198.txid_);
    psVar7 = &local_1b8;
  }
  std::__cxx11::string::~string((string *)psVar7);
  cfd::TransactionContext::~TransactionContext(&tx);
LAB_003b714c:
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&tx,&sighash_bytes);
  pcVar5 = cfd::capi::CreateString((string *)&tx);
  *sighash = pcVar5;
  std::__cxx11::string::~string((string *)&tx);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes);
  return 0;
}

Assistant:

int CfdCreateSighash(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey,
    const char* redeem_script, int64_t value_satoshi, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    WitnessVersion version = WitnessVersion::kVersionNone;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        version = WitnessVersion::kVersion0;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        version = WitnessVersion::kVersion0;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount value(value_satoshi);
    ByteData sighash_bytes;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    }

    *sighash = CreateString(sighash_bytes.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}